

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O3

SQInteger thread_wakeupthrow(HSQUIRRELVM v)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQTable *pSVar3;
  SQFloat SVar4;
  undefined4 uVar5;
  SQObjectValue v_00;
  SQObjectFlags SVar6;
  undefined3 uVar7;
  SQObjectPtr *pSVar8;
  SQInteger SVar9;
  SQRESULT SVar10;
  char *err;
  SQObjectPtr o;
  SQBool rethrow_error;
  SQObject local_28;
  SQBool local_18;
  
  pSVar8 = SQVM::GetAt(v,v->_stackbase);
  local_28._type = (pSVar8->super_SQObject)._type;
  local_28._flags = (pSVar8->super_SQObject)._flags;
  local_28._5_3_ = *(undefined3 *)&(pSVar8->super_SQObject).field_0x5;
  v_00 = (SQObjectValue)(pSVar8->super_SQObject)._unVal.pGenerator;
  if ((local_28._type >> 0x1b & 1) != 0) {
    pSVar1 = &((v_00.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  local_28._unVal = v_00;
  if (local_28._type == OT_THREAD) {
    SVar9 = sq_getvmstate((HSQUIRRELVM)v_00.pTable);
    if (SVar9 == 0) {
      err = "cannot wakeup a idle thread";
    }
    else {
      if (SVar9 != 1) {
        sq_move((HSQUIRRELVM)v_00.pTable,v,2);
        sq_throwobject((HSQUIRRELVM)v_00.pTable);
        local_18 = 1;
        SVar9 = sq_gettop(v);
        if (2 < SVar9) {
          sq_getbool(v,3,&local_18);
        }
        SVar10 = sq_wakeupvm((HSQUIRRELVM)v_00.pTable,0,1,1,1);
        if (SVar10 < 0) {
          sq_settop((HSQUIRRELVM)v_00.pTable,1);
          if (local_18 == 0) {
            SVar10 = 0;
          }
          else {
            SVar2 = (v->_lasterror).super_SQObject._type;
            pSVar3 = (v->_lasterror).super_SQObject._unVal.pTable;
            SVar6 = (((SQObjectPtr *)((long)v_00 + 0x70))->super_SQObject)._flags;
            uVar7 = *(undefined3 *)&(((SQObjectPtr *)((long)v_00 + 0x70))->super_SQObject).field_0x5
            ;
            SVar4 = ((v_00.pNativeClosure)->_name).super_SQObject._unVal.fFloat;
            uVar5 = *(undefined4 *)((long)&((v_00.pNativeClosure)->_name).super_SQObject._unVal + 4)
            ;
            (v->_lasterror).super_SQObject._type =
                 ((v_00.pNativeClosure)->_name).super_SQObject._type;
            (v->_lasterror).super_SQObject._flags = SVar6;
            *(undefined3 *)&(v->_lasterror).super_SQObject.field_0x5 = uVar7;
            (v->_lasterror).super_SQObject._unVal.fFloat = SVar4;
            *(undefined4 *)((long)&(v->_lasterror).super_SQObject._unVal + 4) = uVar5;
            if (((v->_lasterror).super_SQObject._type & 0x8000000) != 0) {
              pSVar1 = &(((v->_lasterror).super_SQObject._unVal.pTable)->super_SQDelegable).
                        super_SQCollectable.super_SQRefCounted._uiRef;
              *pSVar1 = *pSVar1 + 1;
            }
            SVar10 = -1;
            if ((SVar2 >> 0x1b & 1) != 0) {
              pSVar1 = &(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
              *pSVar1 = *pSVar1 - 1;
              if (*pSVar1 == 0) {
                (*(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted.
                  _vptr_SQRefCounted[2])();
              }
            }
          }
        }
        else {
          sq_move(v,(HSQUIRRELVM)v_00.pTable,-1);
          sq_pop((HSQUIRRELVM)v_00.pTable,1);
          SVar9 = sq_getvmstate((HSQUIRRELVM)v_00.pTable);
          SVar10 = 1;
          if (SVar9 == 0) {
            sq_settop((HSQUIRRELVM)v_00.pTable,1);
          }
        }
        goto LAB_001201d4;
      }
      err = "cannot wakeup a running thread";
    }
    SVar10 = sq_throwerror(v,err);
  }
  else {
    SVar10 = sq_throwerror(v,"wrong parameter");
  }
LAB_001201d4:
  SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&local_28);
  return SVar10;
}

Assistant:

static SQInteger thread_wakeupthrow(HSQUIRRELVM v)
{
    SQObjectPtr o = stack_get(v,1);
    if(sq_type(o) == OT_THREAD) {
        SQVM *thread = _thread(o);
        SQInteger state = sq_getvmstate(thread);
        if(state != SQ_VMSTATE_SUSPENDED) {
            switch(state) {
                case SQ_VMSTATE_IDLE:
                    return sq_throwerror(v,_SC("cannot wakeup a idle thread"));
                break;
                case SQ_VMSTATE_RUNNING:
                    return sq_throwerror(v,_SC("cannot wakeup a running thread"));
                break;
            }
        }

        sq_move(thread,v,2);
        sq_throwobject(thread);
        SQBool rethrow_error = SQTrue;
        if(sq_gettop(v) > 2) {
            sq_getbool(v,3,&rethrow_error);
        }
        if(SQ_SUCCEEDED(sq_wakeupvm(thread,SQFalse,SQTrue,SQTrue,SQTrue))) {
            sq_move(v,thread,-1);
            sq_pop(thread,1); //pop retval
            if(sq_getvmstate(thread) == SQ_VMSTATE_IDLE) {
                sq_settop(thread,1); //pop roottable
            }
            return 1;
        }
        sq_settop(thread,1);
        if(rethrow_error) {
            v->_lasterror = thread->_lasterror;
            return SQ_ERROR;
        }
        return SQ_OK;
    }
    return sq_throwerror(v,_SC("wrong parameter"));
}